

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# targets.c
# Opt level: O1

lword writesection(GlobalVars *gv,uint8_t *dest,Reloc *r,lword v)

{
  char cVar1;
  ushort uVar2;
  ulong x;
  int iVar3;
  bool bVar4;
  long v_00;
  uint n;
  RelocInsert *pRVar5;
  byte bVar6;
  uint be;
  lword v_01;
  byte bVar7;
  lword local_50;
  
  cVar1 = gv->endianess;
  bVar7 = r->rtype;
  if (bVar7 == 0) {
LAB_0010fc3b:
    local_50 = 0;
  }
  else {
    bVar7 = bVar7 < 0x23 & (byte)(0x700000734 >> (bVar7 & 0x3f));
    for (pRVar5 = r->insert; be = (uint)(cVar1 != '\0'), pRVar5 != (RelocInsert *)0x0;
        pRVar5 = pRVar5->next) {
      writereloc(be,dest,(uint)pRVar5->bpos,(uint)pRVar5->bsiz,0);
    }
    pRVar5 = (RelocInsert *)&r->insert;
    do {
      pRVar5 = pRVar5->next;
      if (pRVar5 == (RelocInsert *)0x0) goto LAB_0010fc3b;
      x = pRVar5->mask;
      uVar2 = pRVar5->bpos;
      n = (uint)pRVar5->bsiz;
      iVar3 = lshiftcnt(x);
      v_01 = (long)(x & v) >> ((byte)iVar3 & 0x3f);
      bVar6 = -1 < (long)x & bVar7;
      if (bVar6 == 1) {
        v_01 = sign_extend(v_01,n);
      }
      bVar4 = checkrange(v_01,(uint)bVar7,n);
      if (bVar4 != 0) {
        v_00 = readreloc(be,dest,(uint)uVar2,n);
        if (bVar6 != 0) {
          v_00 = sign_extend(v_00,n);
        }
        writereloc(be,dest,(uint)uVar2,n,v_00 + v_01);
        v_01 = local_50;
      }
      local_50 = v_01;
    } while (bVar4 != 0);
  }
  return local_50;
}

Assistant:

lword writesection(struct GlobalVars *gv,uint8_t *dest,struct Reloc *r,lword v)
/* Write 'v' into the bit-field defined by the relocation type in 'r'.
   Do range checks first, depending on the reloc type.
   Returns 0 on success or the masked and normalized value which failed
   on the range check. */
{
  bool be = gv->endianess != _LITTLE_ENDIAN_;
  uint8_t t = r->rtype;
  bool signedval = t==R_PC||t==R_GOTPC||t==R_GOTOFF||t==R_PLTPC||t==R_PLTOFF||
                   t==R_SD||t==R_SD2||t==R_SD21||t==R_MOSDREL;
  struct RelocInsert *ri;

  if (t == R_NONE)
    return 0;

  /* Reset all relocation fields to zero. */
  for (ri=r->insert; ri!=NULL; ri=ri->next)
    writereloc(be,dest,ri->bpos,ri->bsiz,0);

  /* add value to relocation fields */
  for (ri=r->insert; ri!=NULL; ri=ri->next) {
    lword mask = ri->mask;
    lword insval = v & mask;
    lword oldval;
    int bpos = ri->bpos;
    int bsiz = ri->bsiz;

    insval >>= lshiftcnt(mask);  /* normalize according mask */
    if (mask>=0 && signedval)
      insval = sign_extend(insval,bsiz);

    if (!checkrange(insval,signedval,bsiz))
      return insval;  /* range check failed on 'insval' */

    /* add to value already present in this field */
    oldval = readreloc(be,dest,bpos,bsiz);
    if (mask>=0 && signedval)
      oldval = sign_extend(oldval,bsiz);
    writereloc(be,dest,bpos,bsiz,oldval+insval);
  }

  return 0;
}